

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree_FastInst.hpp
# Opt level: O1

bool __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::FastInstancesIterator::
enterNode(FastInstancesIterator *this,Node **curr)

{
  void ***pppvVar1;
  uint uVar2;
  Node *pNVar3;
  undefined8 *puVar4;
  ulong uVar5;
  uint *puVar6;
  NodeAlgorithm NVar7;
  int iVar8;
  Entry *pEVar9;
  Node *pNVar10;
  undefined4 extraout_var;
  NodeAlgorithm *pNVar11;
  Node *pNVar12;
  void *pvVar13;
  NodeAlgorithm **ppNVar14;
  bool bVar15;
  Top TVar16;
  TermList query;
  TermList local_38;
  TermList local_30;
  
  pNVar3 = *curr;
  NVar7 = (*pNVar3->_vptr_Node[5])(pNVar3);
  local_38._content = 2;
  local_30._content = (uint64_t)(*(int *)&pNVar3[1]._vptr_Node * 4 + 3);
  pEVar9 = ::Lib::
           DHMap<Kernel::TermList,_Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::InstMatcher::TermSpec,_Lib::DefaultHash,_Lib::DefaultHash2>
           ::findEntry(&(this->_subst)._bindings,&local_30);
  if (pEVar9 == (Entry *)0x0) {
    local_38._content = 1;
  }
  else {
    local_38._content = (pEVar9->_val).t._content;
  }
  *curr = (Node *)0x0;
  if (NVar7 == UNSORTED_LIST) {
    if ((local_38._content & 3) == 0) {
      pNVar12 = (Node *)&pNVar3[1]._term;
      pNVar10 = (Node *)((TermList *)pNVar12)->_content;
      if (pNVar10 != (Node *)0x0) {
        do {
          uVar5 = (pNVar10->_term)._content;
          if (((uVar5 & 3) == 0) && (*(int *)(uVar5 + 8) == *(int *)(local_38._content + 8))) break;
          pNVar10 = (Node *)(pNVar12->_term)._content;
          pNVar12 = (Node *)&pNVar12->_term;
        } while (pNVar10 != (Node *)0x0);
      }
      bVar15 = pNVar10 != (Node *)0x0;
      if (bVar15) {
        *curr = pNVar10;
        bVar15 = true;
      }
    }
    else {
      *curr = (Node *)pNVar3[1]._term._content;
      pNVar12 = pNVar3 + 2;
      bVar15 = false;
    }
    if (*curr != (Node *)0x0) {
      uVar2 = *(uint *)&pNVar3[1]._vptr_Node;
      if ((this->_specVarNumbers)._cursor == (this->_specVarNumbers)._end) {
        ::Lib::Stack<unsigned_int>::expand(&this->_specVarNumbers);
      }
      puVar6 = (this->_specVarNumbers)._cursor;
      *puVar6 = uVar2;
      (this->_specVarNumbers)._cursor = puVar6 + 1;
    }
    if (bVar15 || pNVar12->_vptr_Node == (_func_int **)0x0) {
      return false;
    }
    if ((this->_alternatives)._cursor == (this->_alternatives)._end) {
      ::Lib::Stack<void_*>::expand(&this->_alternatives);
    }
    *(this->_alternatives)._cursor = pNVar12;
    pppvVar1 = &(this->_alternatives)._cursor;
    *pppvVar1 = *pppvVar1 + 1;
    pNVar11 = (this->_nodeTypes)._cursor;
    NVar7 = UNSORTED_LIST;
  }
  else {
    if ((local_38._content & 3) == 0) {
      TVar16 = Kernel::TermList::top(&local_38);
      pvVar13 = (void *)0x0;
      iVar8 = (*pNVar3->_vptr_Node[10])
                        (pNVar3,TVar16._inner._inner._0_8_,
                         (ulong)(TVar16._inner._inner._8_4_ & 0xff),0);
      if ((undefined8 *)CONCAT44(extraout_var,iVar8) != (undefined8 *)0x0) {
        *curr = *(Node **)CONCAT44(extraout_var,iVar8);
        pvVar13 = (void *)0x0;
      }
    }
    else {
      puVar4 = *(undefined8 **)(pNVar3[1]._term._content + 8);
      *curr = (Node *)*puVar4;
      pvVar13 = (void *)puVar4[1];
    }
    if (*curr != (Node *)0x0) {
      uVar2 = *(uint *)&pNVar3[1]._vptr_Node;
      if ((this->_specVarNumbers)._cursor == (this->_specVarNumbers)._end) {
        ::Lib::Stack<unsigned_int>::expand(&this->_specVarNumbers);
      }
      puVar6 = (this->_specVarNumbers)._cursor;
      *puVar6 = uVar2;
      (this->_specVarNumbers)._cursor = puVar6 + 1;
    }
    if (pvVar13 == (void *)0x0) {
      return false;
    }
    if ((this->_alternatives)._cursor == (this->_alternatives)._end) {
      ::Lib::Stack<void_*>::expand(&this->_alternatives);
    }
    *(this->_alternatives)._cursor = pvVar13;
    pppvVar1 = &(this->_alternatives)._cursor;
    *pppvVar1 = *pppvVar1 + 1;
    pNVar11 = (this->_nodeTypes)._cursor;
  }
  ppNVar14 = &(this->_nodeTypes)._cursor;
  if (pNVar11 == (this->_nodeTypes)._end) {
    ::Lib::
    Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::NodeAlgorithm>
    ::expand(&this->_nodeTypes);
  }
  pNVar11 = *ppNVar14;
  *pNVar11 = NVar7;
  *ppNVar14 = pNVar11 + 1;
  return true;
}

Assistant:

bool SubstitutionTree<LeafData_>::FastInstancesIterator::enterNode(Node*& curr)
{
  ASS(!curr->isLeaf());

  IntermediateNode* inode=static_cast<IntermediateNode*>(curr);
  NodeAlgorithm currType=inode->algorithm();

  TermList query;
  typename InstMatcher::TermSpec querySpec;
  //here we are interested only in the top functor or the fact that the query is a variable
  //so we can discard the information about term origin
  if(_subst.findSpecVarBinding(inode->childVar, querySpec)) {
    query=querySpec.t;
  }
  else {
    query.makeVar(0);//just an arbitrary variable so that anything will match
  }

  curr=0;

  if(currType==UNSORTED_LIST) {
    Node** nl=static_cast<UArrIntermediateNode*>(inode)->_nodes;
    ASS(*nl); //inode is not empty
    bool noAlternatives=false;
    if(query.isTerm()) {
      unsigned bindingFunctor=query.term()->functor();
      //let's skip terms that don't have the same top functor...
      while(*nl && (!(*nl)->term().isTerm() || (*nl)->term().term()->functor()!=bindingFunctor)) {
        nl++;
      }

      if(*nl) {
	//we've found the term with the same top functor
	ASS_EQ((*nl)->term().term()->functor(),bindingFunctor);
        curr=*nl;
        noAlternatives=true; //there is at most one term with each top functor
      }
    } else {
      ASS(query.isVar());
      //everything is matched by a variable
      curr=*nl;
      nl++;
    }

    if(curr) {
      _specVarNumbers.push(inode->childVar);
    }
    if(*nl && !noAlternatives) {
      _alternatives.push(nl);
      _nodeTypes.push(currType);
      return true;
    }
  } else {
    ASS_EQ(currType, SKIP_LIST);
    auto nl=static_cast<SListIntermediateNode*>(inode)->_nodes.listLike();
    ASS(nl); //inode is not empty
    if(query.isTerm()) {
      //only term with the same top functor will be matched by a term
      Node** byTop=inode->childByTop(query.top(), false);
      if(byTop) {
	curr=*byTop;
      }
      nl=0;
    }
    else {
      ASS(query.isVar());
      //everything is matched by a variable
      curr=nl->head();
      nl=nl->tail();
    }

    if(curr) {
      _specVarNumbers.push(inode->childVar);
    }
    if(nl) {
      _alternatives.push(nl);
      _nodeTypes.push(currType);
      return true;
    }
  }
  return false;
}